

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-vec1.c
# Opt level: O1

void mul_mat_vec_f32_2(float *src0,float *src1,float *dst,int nrows,int ncols)

{
  float fVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  long lVar5;
  float *pfVar6;
  ulong uVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  
  if (0 < nrows) {
    uVar4 = ncols & 0xffffffe0;
    lVar5 = (long)ncols;
    pfVar6 = src0 + 0x18;
    uVar7 = 0;
    do {
      auVar9 = ZEXT816(0) << 0x40;
      if (0 < (int)uVar4) {
        lVar8 = 0;
        auVar10 = ZEXT816(0) << 0x40;
        auVar11 = ZEXT816(0) << 0x40;
        auVar13 = ZEXT816(0) << 0x40;
        do {
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),*(undefined1 (*) [32])(pfVar6 + lVar8 + -0x18),
                                   *(undefined1 (*) [32])(src1 + lVar8));
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),*(undefined1 (*) [32])(pfVar6 + lVar8 + -0x10)
                                    ,*(undefined1 (*) [32])(src1 + lVar8 + 8));
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),*(undefined1 (*) [32])(pfVar6 + lVar8 + -8),
                                    *(undefined1 (*) [32])(src1 + lVar8 + 0x10));
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),*(undefined1 (*) [32])(pfVar6 + lVar8),
                                    *(undefined1 (*) [32])(src1 + lVar8 + 0x18));
          lVar8 = lVar8 + 0x20;
        } while (lVar8 < (int)uVar4);
        fVar1 = auVar9._4_4_;
        fVar2 = auVar9._8_4_;
        fVar3 = auVar9._12_4_;
        auVar9._0_4_ = auVar13._0_4_ + auVar11._0_4_ + auVar10._0_4_ + auVar9._0_4_;
        auVar9._4_4_ = auVar13._4_4_ + auVar11._4_4_ + auVar10._4_4_ + fVar1;
        auVar9._8_4_ = auVar13._8_4_ + auVar11._8_4_ + auVar10._8_4_ + fVar2;
        auVar9._12_4_ = auVar13._12_4_ + auVar11._12_4_ + auVar10._12_4_ + fVar3;
      }
      auVar10._0_4_ = auVar9._0_4_ + 0.0;
      auVar10._4_4_ = auVar9._4_4_ + 0.0;
      auVar10._8_4_ = auVar9._8_4_ + 0.0;
      auVar10._12_4_ = auVar9._12_4_ + 0.0;
      auVar9 = vshufpd_avx(auVar10,auVar10,1);
      auVar11._0_4_ = auVar10._0_4_ + auVar9._0_4_;
      auVar11._4_4_ = auVar10._4_4_ + auVar9._4_4_;
      auVar11._8_4_ = auVar10._8_4_ + auVar9._8_4_;
      auVar11._12_4_ = auVar10._12_4_ + auVar9._12_4_;
      auVar9 = vhaddps_avx(auVar11,auVar11);
      dst[uVar7] = auVar9._0_4_;
      if (uVar4 != ncols) {
        auVar12 = ZEXT464((uint)dst[uVar7]);
        lVar8 = (long)(int)uVar4;
        do {
          auVar9 = vfmadd231ss_fma(auVar12._0_16_,ZEXT416((uint)src0[lVar8]),
                                   ZEXT416((uint)src1[lVar8]));
          auVar12 = ZEXT1664(auVar9);
          lVar8 = lVar8 + 1;
        } while (lVar8 < lVar5);
        dst[uVar7] = auVar9._0_4_;
      }
      uVar7 = uVar7 + 1;
      pfVar6 = pfVar6 + lVar5;
      src0 = src0 + lVar5;
    } while (uVar7 != (uint)nrows);
  }
  return;
}

Assistant:

void mul_mat_vec_f32_2(
    const float * restrict src0,
    const float * restrict src1,
    float * dst,
    int nrows,
    int ncols) {

    const int ncols32 = ncols & ~31;

    for (int i = 0; i < nrows; i++) {
        __m256 sum0 = _mm256_setzero_ps();
        __m256 sum1 = _mm256_setzero_ps();
        __m256 sum2 = _mm256_setzero_ps();
        __m256 sum3 = _mm256_setzero_ps();

        const float * restrict src0_row = src0 + i*ncols;
        for (int j = 0; j < ncols32; j += 32) {
            __m256 a0 = _mm256_loadu_ps(src0_row + j + 0);
            __m256 a1 = _mm256_loadu_ps(src0_row + j + 8);
            __m256 a2 = _mm256_loadu_ps(src0_row + j + 16);
            __m256 a3 = _mm256_loadu_ps(src0_row + j + 24);
            __m256 b0 = _mm256_loadu_ps(src1 + j + 0);
            __m256 b1 = _mm256_loadu_ps(src1 + j + 8);
            __m256 b2 = _mm256_loadu_ps(src1 + j + 16);
            __m256 b3 = _mm256_loadu_ps(src1 + j + 24);
#if defined(__FMA__)
            sum0 = _mm256_fmadd_ps(a0, b0, sum0);
            sum1 = _mm256_fmadd_ps(a1, b1, sum1);
            sum2 = _mm256_fmadd_ps(a2, b2, sum2);
            sum3 = _mm256_fmadd_ps(a3, b3, sum3);
#else
            sum0 = _mm256_add_ps(_mm256_mul_ps(a0, b0), sum0);
            sum1 = _mm256_add_ps(_mm256_mul_ps(a1, b1), sum1);
            sum2 = _mm256_add_ps(_mm256_mul_ps(a2, b2), sum2);
            sum3 = _mm256_add_ps(_mm256_mul_ps(a3, b3), sum3);
#endif
        }
        dst[i] = reduce_vector8_0(_mm256_add_ps(_mm256_add_ps(sum0, sum1), _mm256_add_ps(sum2, sum3)));

        for (int j = ncols32; j < ncols; j++) {
            dst[i] += src0[i*ncols + j]*src1[j];
        }
    }
}